

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::BasicProgramMax::Run(BasicProgramMax *this)

{
  bool bVar1;
  BasicProgramMax *this_local;
  
  bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckMaxValue(&this->super_SACSubcaseBase,0x92dc,1)
  ;
  if (bVar1) {
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                      (&this->super_SACSubcaseBase,0x92d8,0x20);
    if (bVar1) {
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                        (&this->super_SACSubcaseBase,0x92d1,1);
      if (bVar1) {
        bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                          (&this->super_SACSubcaseBase,0x92d7,8);
        if (bVar1) {
          bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                            (&this->super_SACSubcaseBase,0x92cc,0);
          if (bVar1) {
            bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                              (&this->super_SACSubcaseBase,0x92d2,0);
            if (bVar1) {
              bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                                (&this->super_SACSubcaseBase,0x8264,1);
              if (bVar1) {
                bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                                  (&this->super_SACSubcaseBase,0x8265,8);
                if (bVar1) {
                  bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                                    (&this->super_SACSubcaseBase,0x92d0,0);
                  if (bVar1) {
                    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                                      (&this->super_SACSubcaseBase,0x92d6,0);
                    if (bVar1) {
                      this_local = (BasicProgramMax *)0x0;
                    }
                    else {
                      this_local = (BasicProgramMax *)&DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    this_local = (BasicProgramMax *)&DAT_ffffffffffffffff;
                  }
                }
                else {
                  this_local = (BasicProgramMax *)&DAT_ffffffffffffffff;
                }
              }
              else {
                this_local = (BasicProgramMax *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (BasicProgramMax *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (BasicProgramMax *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (BasicProgramMax *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicProgramMax *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicProgramMax *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicProgramMax *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!CheckMaxValue(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, 1))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_ATOMIC_COUNTER_BUFFER_SIZE, 32))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_COMBINED_ATOMIC_COUNTER_BUFFERS, 1))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_COMBINED_ATOMIC_COUNTERS, 8))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, 0))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_VERTEX_ATOMIC_COUNTERS, 0))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS, 1))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_COMPUTE_ATOMIC_COUNTERS, 8))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, 0))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_FRAGMENT_ATOMIC_COUNTERS, 0))
			return ERROR;
		return NO_ERROR;
	}